

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<unsigned_char>>
               (char *label_id,GetterXsYs<unsigned_char> *getter,double width)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uchar *puVar9;
  ImPlotPlot *pIVar10;
  ImPlotContext *pIVar11;
  bool bVar12;
  ImU32 col;
  ImU32 col_00;
  long lVar13;
  ImDrawList *this;
  int iVar14;
  int iVar15;
  int iVar16;
  ImPlotRange *pIVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ImVec2 b;
  ImVec2 a;
  byte local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar12 = BeginItem(label_id,1);
  pIVar11 = GImPlot;
  if (bVar12) {
    dVar24 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar14 = getter->Count, 0 < iVar14)) {
      puVar8 = getter->Xs;
      puVar9 = getter->Ys;
      iVar16 = getter->Offset;
      iVar4 = getter->Stride;
      pIVar10 = GImPlot->CurrentPlot;
      iVar5 = pIVar10->CurrentYAxis;
      uVar6 = (pIVar10->XAxis).Flags;
      pIVar17 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar10->YAxis[iVar5].Flags;
      iVar15 = 0;
      do {
        lVar13 = (long)(((iVar16 + iVar15) % iVar14 + iVar14) % iVar14) * (long)iVar4;
        bVar1 = puVar8[lVar13];
        bVar2 = puVar9[lVar13];
        dVar20 = (double)bVar2;
        dVar22 = (double)bVar1 - dVar24;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001f65f6:
            if ((0.0 < dVar22) || ((uVar6 & 0x20) == 0)) {
              dVar21 = (pIVar11->ExtentsX).Min;
              dVar23 = dVar22;
              if (dVar21 <= dVar22) {
                dVar23 = dVar21;
              }
              (pIVar11->ExtentsX).Min = dVar23;
              dVar21 = (pIVar11->ExtentsX).Max;
              dVar23 = dVar22;
              if (dVar22 <= dVar21) {
                dVar23 = dVar21;
              }
              (pIVar11->ExtentsX).Max = dVar23;
            }
          }
        }
        else if ((((long)ABS(dVar22) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar5].Range.Min <= dVar20)) &&
                (dVar20 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001f65f6;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((bVar2 != 0) || ((uVar7 & 0x20) == 0)) {
LAB_001f665e:
            dVar22 = dVar20;
            if (pIVar17->Min <= dVar20) {
              dVar22 = pIVar17->Min;
            }
            pIVar17->Min = dVar22;
            dVar22 = pIVar11->ExtentsY[iVar5].Max;
            if (dVar20 <= dVar22) {
              dVar20 = dVar22;
            }
            pIVar11->ExtentsY[iVar5].Max = dVar20;
          }
        }
        else if ((((pIVar10->XAxis).Range.Min <= dVar22) && (dVar22 <= (pIVar10->XAxis).Range.Max))
                && (local_48 = (byte)((uVar7 & 0x20) >> 5), (bVar2 == 0 & local_48) == 0))
        goto LAB_001f665e;
        dVar20 = (double)bVar1 + dVar24;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar20) < 0x7ff0000000000000) {
LAB_001f66b2:
            if ((0.0 < dVar20) || ((uVar6 & 0x20) == 0)) {
              dVar22 = (pIVar11->ExtentsX).Min;
              dVar21 = dVar20;
              if (dVar22 <= dVar20) {
                dVar21 = dVar22;
              }
              (pIVar11->ExtentsX).Min = dVar21;
              dVar22 = (pIVar11->ExtentsX).Max;
              dVar21 = dVar20;
              if (dVar20 <= dVar22) {
                dVar21 = dVar22;
              }
              (pIVar11->ExtentsX).Max = dVar21;
            }
          }
        }
        else if ((((long)ABS(dVar20) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar5].Range.Min <= 0.0)) &&
                (0.0 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001f66b2;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((uVar7 & 0x20) == 0) {
LAB_001f6710:
            uVar18 = 0;
            uVar19 = 0;
            dVar20 = pIVar17->Min;
            if (dVar20 <= 0.0) {
              uVar18 = SUB84(dVar20,0);
              uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
            }
            pIVar17->Min = (double)CONCAT44(uVar19,uVar18);
            uVar18 = 0;
            uVar19 = 0;
            dVar20 = pIVar11->ExtentsY[iVar5].Max;
            if (0.0 <= dVar20) {
              uVar18 = SUB84(dVar20,0);
              uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
            }
            pIVar11->ExtentsY[iVar5].Max = (double)CONCAT44(uVar19,uVar18);
          }
        }
        else if ((((uVar7 & 0x20) == 0) && ((pIVar10->XAxis).Range.Min <= dVar20)) &&
                (dVar20 <= (pIVar10->XAxis).Range.Max)) goto LAB_001f6710;
        iVar15 = iVar15 + 1;
      } while (iVar14 != iVar15);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar11->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 1);
    iVar14 = getter->Count;
    if (0 < iVar14) {
      bVar12 = (pIVar11->NextItemData).RenderFill;
      bVar3 = (pIVar11->NextItemData).RenderLine;
      iVar16 = 0;
      do {
        lVar13 = (long)(((getter->Offset + iVar16) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride;
        if (getter->Ys[lVar13] != 0) {
          bVar1 = getter->Xs[lVar13];
          local_38 = PlotToPixels((double)bVar1 - dVar24,(double)getter->Ys[lVar13],-1);
          local_40 = PlotToPixels((double)bVar1 + dVar24,0.0,-1);
          if ((pIVar11->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar12 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar11->NextItemData).LineWeight);
          }
        }
        iVar16 = iVar16 + 1;
        iVar14 = getter->Count;
      } while (iVar16 < iVar14);
    }
    pIVar11 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar11->NextItemData);
    pIVar11->PreviousItem = pIVar11->CurrentItem;
    pIVar11->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}